

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglMultiThreadTests.cpp
# Opt level: O0

bool __thiscall
deqp::egl::MultiThreadedConfigTest::runThread(MultiThreadedConfigTest *this,TestThread *thread)

{
  EGLDisplay pvVar1;
  int iVar2;
  deUint32 dVar3;
  Library *pLVar4;
  ThreadLog *pTVar5;
  size_type sVar6;
  reference ppvVar7;
  char *local_170;
  uint local_168;
  int local_164;
  EGLBoolean result_4;
  EGLint value;
  EGLConfig config;
  EGLint attribute;
  int queryNdx;
  __normal_iterator<void_**,_std::vector<void_*,_std::allocator<void_*>_>_> local_148;
  const_iterator local_140;
  __normal_iterator<void_**,_std::vector<void_*,_std::allocator<void_*>_>_> local_138;
  __normal_iterator<void_**,_std::vector<void_*,_std::allocator<void_*>_>_> local_130;
  const_iterator local_128;
  int local_11c;
  iterator iStack_118;
  int popCount_1;
  __normal_iterator<void_**,_std::vector<void_*,_std::allocator<void_*>_>_> local_110;
  const_iterator local_108;
  __normal_iterator<void_**,_std::vector<void_*,_std::allocator<void_*>_>_> local_100;
  __normal_iterator<void_**,_std::vector<void_*,_std::allocator<void_*>_>_> local_f8;
  const_iterator local_f0;
  uint local_e8;
  uint local_e4;
  EGLBoolean result_3;
  EGLBoolean result_2;
  EGLint configCount_1;
  int chooseConfigsNdx;
  __normal_iterator<void_**,_std::vector<void_*,_std::allocator<void_*>_>_> local_d0;
  const_iterator local_c8;
  __normal_iterator<void_**,_std::vector<void_*,_std::allocator<void_*>_>_> local_c0;
  __normal_iterator<void_**,_std::vector<void_*,_std::allocator<void_*>_>_> local_b8;
  const_iterator local_b0;
  int local_a4;
  iterator iStack_a0;
  int popCount;
  __normal_iterator<void_**,_std::vector<void_*,_std::allocator<void_*>_>_> local_98;
  const_iterator local_90;
  __normal_iterator<void_**,_std::vector<void_*,_std::allocator<void_*>_>_> local_88;
  __normal_iterator<void_**,_std::vector<void_*,_std::allocator<void_*>_>_> local_80;
  const_iterator local_78;
  uint local_70 [2];
  EGLBoolean result_1;
  uint local_64;
  EGLBoolean result;
  EGLint configCount;
  int getConfigsNdx;
  undefined1 local_50 [8];
  vector<void_*,_std::allocator<void_*>_> configs;
  Random rnd;
  Library *egl;
  TestThread *thread_local;
  MultiThreadedConfigTest *this_local;
  
  pLVar4 = MultiThreadedTest::getLibrary(&this->super_MultiThreadedTest);
  iVar2 = TestThread::getId(thread);
  dVar3 = ::deInt32Hash(iVar2 + 0x28c3);
  de::Random::Random((Random *)
                     &configs.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage,dVar3);
  std::vector<void_*,_std::allocator<void_*>_>::vector
            ((vector<void_*,_std::allocator<void_*>_> *)local_50);
  MultiThreadedTest::barrier(&this->super_MultiThreadedTest,thread);
  for (result = 0; (int)result < this->m_getConfigs; result = result + 1) {
    result_1 = (*pLVar4->_vptr_Library[0x1a])(pLVar4,(this->super_MultiThreadedTest).m_display,0);
    pTVar5 = TestThread::getLog(thread);
    pTVar5 = ThreadLog::operator<<(pTVar5,(BeginMessageToken *)&ThreadLog::BeginMessage);
    pTVar5 = ThreadLog::operator<<(pTVar5,&result_1);
    pTVar5 = ThreadLog::operator<<(pTVar5,(char (*) [18])" = eglGetConfigs(");
    pTVar5 = ThreadLog::operator<<(pTVar5,&(this->super_MultiThreadedTest).m_display);
    pTVar5 = ThreadLog::operator<<(pTVar5,(char (*) [12])0x2b4ee5f);
    pTVar5 = ThreadLog::operator<<(pTVar5,(int *)&local_64);
    pTVar5 = ThreadLog::operator<<(pTVar5,(char (*) [2])0x2a94734);
    ThreadLog::operator<<(pTVar5,(EndMessageToken *)&ThreadLog::EndMessage);
    dVar3 = (*pLVar4->_vptr_Library[0x1f])();
    eglu::checkError(dVar3,"eglGetConfigs()",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglMultiThreadTests.cpp"
                     ,0x238);
    if (result_1 == 0) {
      this_local._7_1_ = false;
      goto LAB_01779aa2;
    }
    sVar6 = std::vector<void_*,_std::allocator<void_*>_>::size
                      ((vector<void_*,_std::allocator<void_*>_> *)local_50);
    std::vector<void_*,_std::allocator<void_*>_>::resize
              ((vector<void_*,_std::allocator<void_*>_> *)local_50,sVar6 + (long)(int)local_64);
    if (local_64 != 0) {
      pvVar1 = (this->super_MultiThreadedTest).m_display;
      sVar6 = std::vector<void_*,_std::allocator<void_*>_>::size
                        ((vector<void_*,_std::allocator<void_*>_> *)local_50);
      ppvVar7 = std::vector<void_*,_std::allocator<void_*>_>::operator[]
                          ((vector<void_*,_std::allocator<void_*>_> *)local_50,
                           sVar6 - (long)(int)local_64);
      local_70[0] = (*pLVar4->_vptr_Library[0x1a])(pLVar4,pvVar1,ppvVar7,(ulong)local_64);
      pTVar5 = TestThread::getLog(thread);
      pTVar5 = ThreadLog::operator<<(pTVar5,(BeginMessageToken *)&ThreadLog::BeginMessage);
      pTVar5 = ThreadLog::operator<<(pTVar5,local_70);
      pTVar5 = ThreadLog::operator<<(pTVar5,(char (*) [18])" = eglGetConfigs(");
      pTVar5 = ThreadLog::operator<<(pTVar5,&(this->super_MultiThreadedTest).m_display);
      pTVar5 = ThreadLog::operator<<(pTVar5,(char (*) [13])", &configs\' ");
      pTVar5 = ThreadLog::operator<<(pTVar5,(int *)&local_64);
      pTVar5 = ThreadLog::operator<<(pTVar5,(char (*) [3])0x2a4b1eb);
      pTVar5 = ThreadLog::operator<<(pTVar5,(int *)&local_64);
      pTVar5 = ThreadLog::operator<<(pTVar5,(char (*) [2])0x2a94734);
      ThreadLog::operator<<(pTVar5,(EndMessageToken *)&ThreadLog::EndMessage);
      dVar3 = (*pLVar4->_vptr_Library[0x1f])();
      eglu::checkError(dVar3,"eglGetConfigs()",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglMultiThreadTests.cpp"
                       ,0x247);
      if (local_70[0] == 0) {
        this_local._7_1_ = false;
        goto LAB_01779aa2;
      }
    }
    sVar6 = std::vector<void_*,_std::allocator<void_*>_>::size
                      ((vector<void_*,_std::allocator<void_*>_> *)local_50);
    if (sVar6 < 0x29) {
      sVar6 = std::vector<void_*,_std::allocator<void_*>_>::size
                        ((vector<void_*,_std::allocator<void_*>_> *)local_50);
      local_a4 = de::Random::getInt((Random *)
                                    &configs.super__Vector_base<void_*,_std::allocator<void_*>_>.
                                     _M_impl.super__Vector_impl_data._M_end_of_storage,0,
                                    (int)sVar6 + -2);
      local_c0._M_current =
           (void **)std::vector<void_*,_std::allocator<void_*>_>::begin
                              ((vector<void_*,_std::allocator<void_*>_> *)local_50);
      sVar6 = std::vector<void_*,_std::allocator<void_*>_>::size
                        ((vector<void_*,_std::allocator<void_*>_> *)local_50);
      local_b8 = __gnu_cxx::
                 __normal_iterator<void_**,_std::vector<void_*,_std::allocator<void_*>_>_>::
                 operator+(&local_c0,sVar6 - (long)local_a4);
      __gnu_cxx::__normal_iterator<void*const*,std::vector<void*,std::allocator<void*>>>::
      __normal_iterator<void**>
                ((__normal_iterator<void*const*,std::vector<void*,std::allocator<void*>>> *)
                 &local_b0,&local_b8);
      local_d0._M_current =
           (void **)std::vector<void_*,_std::allocator<void_*>_>::end
                              ((vector<void_*,_std::allocator<void_*>_> *)local_50);
      __gnu_cxx::__normal_iterator<void*const*,std::vector<void*,std::allocator<void*>>>::
      __normal_iterator<void**>
                ((__normal_iterator<void*const*,std::vector<void*,std::allocator<void*>>> *)
                 &local_c8,&local_d0);
      _configCount_1 =
           std::vector<void_*,_std::allocator<void_*>_>::erase
                     ((vector<void_*,_std::allocator<void_*>_> *)local_50,local_b0,local_c8);
    }
    else {
      local_88._M_current =
           (void **)std::vector<void_*,_std::allocator<void_*>_>::begin
                              ((vector<void_*,_std::allocator<void_*>_> *)local_50);
      local_80 = __gnu_cxx::
                 __normal_iterator<void_**,_std::vector<void_*,_std::allocator<void_*>_>_>::
                 operator+(&local_88,0x28);
      __gnu_cxx::__normal_iterator<void*const*,std::vector<void*,std::allocator<void*>>>::
      __normal_iterator<void**>
                ((__normal_iterator<void*const*,std::vector<void*,std::allocator<void*>>> *)
                 &local_78,&local_80);
      local_98._M_current =
           (void **)std::vector<void_*,_std::allocator<void_*>_>::end
                              ((vector<void_*,_std::allocator<void_*>_> *)local_50);
      __gnu_cxx::__normal_iterator<void*const*,std::vector<void*,std::allocator<void*>>>::
      __normal_iterator<void**>
                ((__normal_iterator<void*const*,std::vector<void*,std::allocator<void*>>> *)
                 &local_90,&local_98);
      iStack_a0 = std::vector<void_*,_std::allocator<void_*>_>::erase
                            ((vector<void_*,_std::allocator<void_*>_> *)local_50,local_78,local_90);
    }
  }
  for (result_2 = 0; (int)result_2 < this->m_chooseConfigs; result_2 = result_2 + 1) {
    local_e4 = (*pLVar4->_vptr_Library[2])
                         (pLVar4,(this->super_MultiThreadedTest).m_display,runThread::attribList,0,0
                          ,&result_3);
    pTVar5 = TestThread::getLog(thread);
    pTVar5 = ThreadLog::operator<<(pTVar5,(BeginMessageToken *)&ThreadLog::BeginMessage);
    pTVar5 = ThreadLog::operator<<(pTVar5,&local_e4);
    pTVar5 = ThreadLog::operator<<(pTVar5,(char (*) [20])" = eglChooseConfig(");
    pTVar5 = ThreadLog::operator<<(pTVar5,&(this->super_MultiThreadedTest).m_display);
    pTVar5 = ThreadLog::operator<<(pTVar5,(char (*) [26])", { EGL_NONE }, NULL, 0, ");
    pTVar5 = ThreadLog::operator<<(pTVar5,(int *)&result_3);
    pTVar5 = ThreadLog::operator<<(pTVar5,(char (*) [2])0x2a94734);
    ThreadLog::operator<<(pTVar5,(EndMessageToken *)&ThreadLog::EndMessage);
    dVar3 = (*pLVar4->_vptr_Library[0x1f])();
    eglu::checkError(dVar3,"eglChooseConfig()",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglMultiThreadTests.cpp"
                     ,0x268);
    if (local_e4 == 0) {
      this_local._7_1_ = false;
      goto LAB_01779aa2;
    }
    sVar6 = std::vector<void_*,_std::allocator<void_*>_>::size
                      ((vector<void_*,_std::allocator<void_*>_> *)local_50);
    std::vector<void_*,_std::allocator<void_*>_>::resize
              ((vector<void_*,_std::allocator<void_*>_> *)local_50,sVar6 + (long)(int)result_3);
    if (result_3 != 0) {
      pvVar1 = (this->super_MultiThreadedTest).m_display;
      sVar6 = std::vector<void_*,_std::allocator<void_*>_>::size
                        ((vector<void_*,_std::allocator<void_*>_> *)local_50);
      ppvVar7 = std::vector<void_*,_std::allocator<void_*>_>::operator[]
                          ((vector<void_*,_std::allocator<void_*>_> *)local_50,
                           sVar6 - (long)(int)result_3);
      local_e8 = (*pLVar4->_vptr_Library[2])
                           (pLVar4,pvVar1,runThread::attribList,ppvVar7,(ulong)result_3,&result_3);
      pTVar5 = TestThread::getLog(thread);
      pTVar5 = ThreadLog::operator<<(pTVar5,(BeginMessageToken *)&ThreadLog::BeginMessage);
      pTVar5 = ThreadLog::operator<<(pTVar5,&local_e8);
      pTVar5 = ThreadLog::operator<<(pTVar5,(char (*) [20])" = eglChooseConfig(");
      pTVar5 = ThreadLog::operator<<(pTVar5,&(this->super_MultiThreadedTest).m_display);
      pTVar5 = ThreadLog::operator<<(pTVar5,(char (*) [27])", { EGL_NONE }, &configs, ");
      pTVar5 = ThreadLog::operator<<(pTVar5,(int *)&result_3);
      pTVar5 = ThreadLog::operator<<(pTVar5,(char (*) [3])0x2a4b1eb);
      pTVar5 = ThreadLog::operator<<(pTVar5,(int *)&result_3);
      pTVar5 = ThreadLog::operator<<(pTVar5,(char (*) [2])0x2a94734);
      ThreadLog::operator<<(pTVar5,(EndMessageToken *)&ThreadLog::EndMessage);
      dVar3 = (*pLVar4->_vptr_Library[0x1f])();
      eglu::checkError(dVar3,"eglChooseConfig()",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglMultiThreadTests.cpp"
                       ,0x277);
      if (local_e8 == 0) {
        this_local._7_1_ = false;
        goto LAB_01779aa2;
      }
    }
    sVar6 = std::vector<void_*,_std::allocator<void_*>_>::size
                      ((vector<void_*,_std::allocator<void_*>_> *)local_50);
    if (sVar6 < 0x29) {
      sVar6 = std::vector<void_*,_std::allocator<void_*>_>::size
                        ((vector<void_*,_std::allocator<void_*>_> *)local_50);
      local_11c = de::Random::getInt((Random *)
                                     &configs.super__Vector_base<void_*,_std::allocator<void_*>_>.
                                      _M_impl.super__Vector_impl_data._M_end_of_storage,0,
                                     (int)sVar6 + -2);
      local_138._M_current =
           (void **)std::vector<void_*,_std::allocator<void_*>_>::begin
                              ((vector<void_*,_std::allocator<void_*>_> *)local_50);
      sVar6 = std::vector<void_*,_std::allocator<void_*>_>::size
                        ((vector<void_*,_std::allocator<void_*>_> *)local_50);
      local_130 = __gnu_cxx::
                  __normal_iterator<void_**,_std::vector<void_*,_std::allocator<void_*>_>_>::
                  operator+(&local_138,sVar6 - (long)local_11c);
      __gnu_cxx::__normal_iterator<void*const*,std::vector<void*,std::allocator<void*>>>::
      __normal_iterator<void**>
                ((__normal_iterator<void*const*,std::vector<void*,std::allocator<void*>>> *)
                 &local_128,&local_130);
      local_148._M_current =
           (void **)std::vector<void_*,_std::allocator<void_*>_>::end
                              ((vector<void_*,_std::allocator<void_*>_> *)local_50);
      __gnu_cxx::__normal_iterator<void*const*,std::vector<void*,std::allocator<void*>>>::
      __normal_iterator<void**>
                ((__normal_iterator<void*const*,std::vector<void*,std::allocator<void*>>> *)
                 &local_140,&local_148);
      _attribute = std::vector<void_*,_std::allocator<void_*>_>::erase
                             ((vector<void_*,_std::allocator<void_*>_> *)local_50,local_128,
                              local_140);
    }
    else {
      local_100._M_current =
           (void **)std::vector<void_*,_std::allocator<void_*>_>::begin
                              ((vector<void_*,_std::allocator<void_*>_> *)local_50);
      local_f8 = __gnu_cxx::
                 __normal_iterator<void_**,_std::vector<void_*,_std::allocator<void_*>_>_>::
                 operator+(&local_100,0x28);
      __gnu_cxx::__normal_iterator<void*const*,std::vector<void*,std::allocator<void*>>>::
      __normal_iterator<void**>
                ((__normal_iterator<void*const*,std::vector<void*,std::allocator<void*>>> *)
                 &local_f0,&local_f8);
      local_110._M_current =
           (void **)std::vector<void_*,_std::allocator<void_*>_>::end
                              ((vector<void_*,_std::allocator<void_*>_> *)local_50);
      __gnu_cxx::__normal_iterator<void*const*,std::vector<void*,std::allocator<void*>>>::
      __normal_iterator<void**>
                ((__normal_iterator<void*const*,std::vector<void*,std::allocator<void*>>> *)
                 &local_108,&local_110);
      iStack_118 = std::vector<void_*,_std::allocator<void_*>_>::erase
                             ((vector<void_*,_std::allocator<void_*>_> *)local_50,local_f0,local_108
                             );
    }
  }
  config._4_4_ = 0;
  do {
    if (this->m_query <= config._4_4_) {
      this_local._7_1_ = true;
LAB_01779aa2:
      local_70[1] = 1;
      std::vector<void_*,_std::allocator<void_*>_>::~vector
                ((vector<void_*,_std::allocator<void_*>_> *)local_50);
      de::Random::~Random((Random *)
                          &configs.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage);
      return this_local._7_1_;
    }
    iVar2 = de::Random::getInt((Random *)
                               &configs.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage,0,0x1f);
    config._0_4_ = runThread::attributes[iVar2];
    sVar6 = std::vector<void_*,_std::allocator<void_*>_>::size
                      ((vector<void_*,_std::allocator<void_*>_> *)local_50);
    iVar2 = de::Random::getInt((Random *)
                               &configs.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage,0,(int)sVar6 + -1);
    ppvVar7 = std::vector<void_*,_std::allocator<void_*>_>::operator[]
                        ((vector<void_*,_std::allocator<void_*>_> *)local_50,(long)iVar2);
    _result_4 = *ppvVar7;
    local_168 = (*pLVar4->_vptr_Library[0x19])
                          (pLVar4,(this->super_MultiThreadedTest).m_display,_result_4,
                           (ulong)(uint)config,&local_164);
    pTVar5 = TestThread::getLog(thread);
    pTVar5 = ThreadLog::operator<<(pTVar5,(BeginMessageToken *)&ThreadLog::BeginMessage);
    pTVar5 = ThreadLog::operator<<(pTVar5,&local_168);
    pTVar5 = ThreadLog::operator<<(pTVar5,(char (*) [23])" = eglGetConfigAttrib(");
    pTVar5 = ThreadLog::operator<<(pTVar5,&(this->super_MultiThreadedTest).m_display);
    pTVar5 = ThreadLog::operator<<(pTVar5,(char (*) [3])0x2a4b1eb);
    pTVar5 = ThreadLog::operator<<(pTVar5,(void **)&result_4);
    pTVar5 = ThreadLog::operator<<(pTVar5,(char (*) [3])0x2a4b1eb);
    local_170 = anon_unknown_7::configAttributeToString((uint)config);
    pTVar5 = ThreadLog::operator<<(pTVar5,&local_170);
    pTVar5 = ThreadLog::operator<<(pTVar5,(char (*) [3])0x2a4b1eb);
    pTVar5 = ThreadLog::operator<<(pTVar5,&local_164);
    pTVar5 = ThreadLog::operator<<(pTVar5,(char (*) [2])0x2a94734);
    ThreadLog::operator<<(pTVar5,(EndMessageToken *)&ThreadLog::EndMessage);
    dVar3 = (*pLVar4->_vptr_Library[0x1f])();
    eglu::checkError(dVar3,"eglGetConfigAttrib()",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglMultiThreadTests.cpp"
                     ,0x2b9);
    if (local_168 == 0) {
      this_local._7_1_ = false;
      goto LAB_01779aa2;
    }
    config._4_4_ = config._4_4_ + 1;
  } while( true );
}

Assistant:

bool MultiThreadedConfigTest::runThread (TestThread& thread)
{
	const Library&		egl		= getLibrary();
	de::Random			rnd		(deInt32Hash(thread.getId() + 10435));
	vector<EGLConfig>	configs;

	barrier(thread);

	for (int getConfigsNdx = 0; getConfigsNdx < m_getConfigs; getConfigsNdx++)
	{
		EGLint configCount;

		// Get number of configs
		{
			EGLBoolean result;

			result = egl.getConfigs(m_display, NULL, 0, &configCount);
			thread.getLog() << ThreadLog::BeginMessage << result << " = eglGetConfigs(" << m_display << ", NULL, 0, " << configCount << ")" <<  ThreadLog::EndMessage;
			EGLU_CHECK_MSG(egl, "eglGetConfigs()");

			if (!result)
				return false;
		}

		configs.resize(configs.size() + configCount);

		// Get configs
		if (configCount != 0)
		{
			EGLBoolean result;

			result = egl.getConfigs(m_display, &(configs[configs.size() - configCount]), configCount, &configCount);
			thread.getLog() << ThreadLog::BeginMessage << result << " = eglGetConfigs(" << m_display << ", &configs' " << configCount << ", " << configCount << ")" <<  ThreadLog::EndMessage;
			EGLU_CHECK_MSG(egl, "eglGetConfigs()");

			if (!result)
				return false;
		}

		// Pop configs to stop config list growing
		if (configs.size() > 40)
		{
			configs.erase(configs.begin() + 40, configs.end());
		}
		else
		{
			const int popCount = rnd.getInt(0, (int)(configs.size()-2));

			configs.erase(configs.begin() + (configs.size() - popCount), configs.end());
		}
	}

	for (int chooseConfigsNdx = 0; chooseConfigsNdx < m_chooseConfigs; chooseConfigsNdx++)
	{
		EGLint configCount;

		static const EGLint attribList[] = {
			EGL_NONE
		};

		// Get number of configs
		{
			EGLBoolean result;

			result = egl.chooseConfig(m_display, attribList, NULL, 0, &configCount);
			thread.getLog() << ThreadLog::BeginMessage << result << " = eglChooseConfig(" << m_display << ", { EGL_NONE }, NULL, 0, " << configCount << ")" <<  ThreadLog::EndMessage;
			EGLU_CHECK_MSG(egl, "eglChooseConfig()");

			if (!result)
				return false;
		}

		configs.resize(configs.size() + configCount);

		// Get configs
		if (configCount != 0)
		{
			EGLBoolean result;

			result = egl.chooseConfig(m_display, attribList, &(configs[configs.size() - configCount]), configCount, &configCount);
			thread.getLog() << ThreadLog::BeginMessage << result << " = eglChooseConfig(" << m_display << ", { EGL_NONE }, &configs, " << configCount << ", " << configCount << ")" <<  ThreadLog::EndMessage;
			EGLU_CHECK_MSG(egl, "eglChooseConfig()");

			if (!result)
				return false;
		}

		// Pop configs to stop config list growing
		if (configs.size() > 40)
		{
			configs.erase(configs.begin() + 40, configs.end());
		}
		else
		{
			const int popCount = rnd.getInt(0, (int)(configs.size()-2));

			configs.erase(configs.begin() + (configs.size() - popCount), configs.end());
		}
	}

	{
		// Perform queries on configs
		static const EGLint attributes[] =
		{
			EGL_BUFFER_SIZE,
			EGL_RED_SIZE,
			EGL_GREEN_SIZE,
			EGL_BLUE_SIZE,
			EGL_LUMINANCE_SIZE,
			EGL_ALPHA_SIZE,
			EGL_ALPHA_MASK_SIZE,
			EGL_BIND_TO_TEXTURE_RGB,
			EGL_BIND_TO_TEXTURE_RGBA,
			EGL_COLOR_BUFFER_TYPE,
			EGL_CONFIG_CAVEAT,
			EGL_CONFIG_ID,
			EGL_CONFORMANT,
			EGL_DEPTH_SIZE,
			EGL_LEVEL,
			EGL_MAX_PBUFFER_WIDTH,
			EGL_MAX_PBUFFER_HEIGHT,
			EGL_MAX_PBUFFER_PIXELS,
			EGL_MAX_SWAP_INTERVAL,
			EGL_MIN_SWAP_INTERVAL,
			EGL_NATIVE_RENDERABLE,
			EGL_NATIVE_VISUAL_ID,
			EGL_NATIVE_VISUAL_TYPE,
			EGL_RENDERABLE_TYPE,
			EGL_SAMPLE_BUFFERS,
			EGL_SAMPLES,
			EGL_STENCIL_SIZE,
			EGL_SURFACE_TYPE,
			EGL_TRANSPARENT_TYPE,
			EGL_TRANSPARENT_RED_VALUE,
			EGL_TRANSPARENT_GREEN_VALUE,
			EGL_TRANSPARENT_BLUE_VALUE
		};

		for (int queryNdx = 0; queryNdx < m_query; queryNdx++)
		{
			const EGLint	attribute	= attributes[rnd.getInt(0, DE_LENGTH_OF_ARRAY(attributes)-1)];
			EGLConfig		config		= configs[rnd.getInt(0, (int)(configs.size()-1))];
			EGLint			value;
			EGLBoolean		result;

			result = egl.getConfigAttrib(m_display, config, attribute, &value);
			thread.getLog() << ThreadLog::BeginMessage << result << " = eglGetConfigAttrib(" << m_display << ", " << config << ", " << configAttributeToString(attribute) << ", " << value << ")" <<  ThreadLog::EndMessage;
			EGLU_CHECK_MSG(egl, "eglGetConfigAttrib()");

			if (!result)
				return false;
		}
	}

	return true;
}